

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.h
# Opt level: O0

bool QObject::
     disconnect<void(QItemSelectionModel::*)(QModelIndex_const&,QModelIndex_const&),void(QAbstractItemView::*)(QModelIndex_const&,QModelIndex_const&)>
               (Object *sender,offset_in_QItemSelectionModel_to_subr signal,Object *receiver,
               offset_in_QAbstractItemView_to_subr slot)

{
  byte bVar1;
  QObject *in_RCX;
  QObject *in_RDI;
  long in_FS_OFFSET;
  void *local_28 [2];
  void *local_18 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QObject::disconnectImpl
                    (in_RDI,local_18,in_RCX,local_28,
                     (QMetaObject *)&QItemSelectionModel::staticMetaObject);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar1 & 1);
  }
  __stack_chk_fail();
}

Assistant:

static inline bool disconnect(const typename QtPrivate::FunctionPointer<Func1>::Object *sender, Func1 signal,
                                  const typename QtPrivate::FunctionPointer<Func2>::Object *receiver, Func2 slot)
    {
        typedef QtPrivate::FunctionPointer<Func1> SignalType;
        typedef QtPrivate::FunctionPointer<Func2> SlotType;

        static_assert(QtPrivate::HasQ_OBJECT_Macro<typename SignalType::Object>::Value,
                          "No Q_OBJECT in the class with the signal");

        //compilation error if the arguments does not match.
        static_assert((QtPrivate::CheckCompatibleArguments<typename SignalType::Arguments, typename SlotType::Arguments>::value),
                          "Signal and slot arguments are not compatible.");

        return disconnectImpl(sender, reinterpret_cast<void **>(&signal), receiver, reinterpret_cast<void **>(&slot),
                              &SignalType::Object::staticMetaObject);
    }